

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp_test.c
# Opt level: O0

bool_t botpTest(void)

{
  int iVar1;
  bool_t bVar2;
  err_t eVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  octet *poVar7;
  octet *poVar8;
  octet *src;
  char *dest;
  octet state [2048];
  tm_time_t t;
  char s_str [136];
  char p_str [72];
  octet p [32];
  char q [32];
  char suite [43];
  char otp3 [16];
  char otp2 [16];
  char otp1 [16];
  char otp [16];
  octet ctr [8];
  octet *in_stack_fffffffffffff468;
  char *pcVar9;
  char *pcVar10;
  octet *in_stack_fffffffffffff470;
  char *str1;
  octet *in_stack_fffffffffffff478;
  octet *in_stack_fffffffffffff480;
  octet *in_stack_fffffffffffff488;
  octet *in_stack_fffffffffffff490;
  octet *in_stack_fffffffffffff498;
  char *in_stack_fffffffffffff4a0;
  char *otp_00;
  octet *in_stack_fffffffffffff4a8;
  octet *in_stack_fffffffffffff4b0;
  octet *in_stack_fffffffffffff4b8;
  octet *in_stack_fffffffffffff4c0;
  tm_time_t in_stack_fffffffffffff4c8;
  octet *p_00;
  char local_c8 [32];
  char local_a8 [32];
  octet local_88 [96];
  octet local_28 [20];
  char local_14 [12];
  
  memcpy(local_88,"OCRA-1:HOTP-HBELT-8:C-QN08-PHBELT-S064-T1M",0x2b);
  sVar4 = botpHOTP_keep();
  sVar5 = botpTOTP_keep();
  sVar6 = botpOCRA_keep();
  sVar4 = utilMax(3,sVar4,sVar5,sVar6);
  if (sVar4 < 0x801) {
    beltH();
    memCopy(in_stack_fffffffffffff470,in_stack_fffffffffffff468,0x1132d5);
    beltH();
    botpHOTPStart(in_stack_fffffffffffff490,(size_t)in_stack_fffffffffffff488,
                  in_stack_fffffffffffff480,(size_t)in_stack_fffffffffffff478);
    botpHOTPStepS(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    botpHOTPStepG(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    botpHOTPStepR((char *)in_stack_fffffffffffff490,in_stack_fffffffffffff488);
    iVar1 = strCmp((char *)in_stack_fffffffffffff470,(char *)in_stack_fffffffffffff468);
    if (iVar1 == 0) {
      botpHOTPStepS(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
      bVar2 = botpHOTPStepV((char *)in_stack_fffffffffffff478,in_stack_fffffffffffff470);
      if (bVar2 != 0) {
        beltH();
        botpHOTPRand((char *)in_stack_fffffffffffff488,(size_t)in_stack_fffffffffffff480,
                     in_stack_fffffffffffff478,(size_t)in_stack_fffffffffffff470,
                     in_stack_fffffffffffff468);
        iVar1 = strCmp((char *)in_stack_fffffffffffff470,(char *)in_stack_fffffffffffff468);
        if (iVar1 == 0) {
          beltH();
          eVar3 = botpHOTPVerify((char *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
                                 (size_t)in_stack_fffffffffffff488,in_stack_fffffffffffff480);
          if (eVar3 == 0) {
            botpHOTPStepR((char *)in_stack_fffffffffffff490,in_stack_fffffffffffff488);
            iVar1 = strCmp((char *)in_stack_fffffffffffff470,(char *)in_stack_fffffffffffff468);
            if (iVar1 != 0) {
              return 0;
            }
            botpHOTPStepR((char *)in_stack_fffffffffffff490,in_stack_fffffffffffff488);
            iVar1 = strCmp((char *)in_stack_fffffffffffff470,(char *)in_stack_fffffffffffff468);
            if (iVar1 != 0) {
              return 0;
            }
            botpHOTPStepG(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
            beltH();
            botpTOTPStart(in_stack_fffffffffffff490,(size_t)in_stack_fffffffffffff488,
                          in_stack_fffffffffffff480,(size_t)in_stack_fffffffffffff478);
            botpTOTPStepR((char *)in_stack_fffffffffffff490,(tm_time_t)in_stack_fffffffffffff488,
                          in_stack_fffffffffffff480);
            iVar1 = strCmp((char *)in_stack_fffffffffffff470,(char *)in_stack_fffffffffffff468);
            if (iVar1 != 0) {
              return 0;
            }
            bVar2 = botpTOTPStepV((char *)in_stack_fffffffffffff480,
                                  (tm_time_t)in_stack_fffffffffffff478,in_stack_fffffffffffff470);
            if (bVar2 == 0) {
              return 0;
            }
            beltH();
            botpTOTPRand((char *)in_stack_fffffffffffff488,(size_t)in_stack_fffffffffffff480,
                         in_stack_fffffffffffff478,(size_t)in_stack_fffffffffffff470,
                         (tm_time_t)in_stack_fffffffffffff468);
            iVar1 = strCmp((char *)in_stack_fffffffffffff470,(char *)in_stack_fffffffffffff468);
            if (iVar1 == 0) {
              beltH();
              eVar3 = botpTOTPVerify((char *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
                                     (size_t)in_stack_fffffffffffff488,
                                     (tm_time_t)in_stack_fffffffffffff480);
              if (eVar3 == 0) {
                beltH();
                botpTOTPStart(in_stack_fffffffffffff490,(size_t)in_stack_fffffffffffff488,
                              in_stack_fffffffffffff480,(size_t)in_stack_fffffffffffff478);
                botpTOTPStepR((char *)in_stack_fffffffffffff490,(tm_time_t)in_stack_fffffffffffff488
                              ,in_stack_fffffffffffff480);
                iVar1 = strCmp((char *)in_stack_fffffffffffff470,(char *)in_stack_fffffffffffff468);
                if (iVar1 != 0) {
                  return 0;
                }
                beltH();
                botpTOTPStart(in_stack_fffffffffffff490,(size_t)in_stack_fffffffffffff488,
                              in_stack_fffffffffffff480,(size_t)in_stack_fffffffffffff478);
                botpTOTPStepR((char *)in_stack_fffffffffffff490,(tm_time_t)in_stack_fffffffffffff488
                              ,in_stack_fffffffffffff480);
                iVar1 = strCmp((char *)in_stack_fffffffffffff470,(char *)in_stack_fffffffffffff468);
                if (iVar1 != 0) {
                  return 0;
                }
                beltH();
                bVar2 = botpOCRAStart(in_stack_fffffffffffff4b8,(char *)in_stack_fffffffffffff4b0,
                                      in_stack_fffffffffffff4a8,(size_t)in_stack_fffffffffffff4a0);
                if (bVar2 == 0) {
                  beltH();
                  bVar2 = botpOCRAStart(in_stack_fffffffffffff4b8,(char *)in_stack_fffffffffffff4b0,
                                        in_stack_fffffffffffff4a8,(size_t)in_stack_fffffffffffff4a0)
                  ;
                  if (bVar2 == 0) {
                    beltH();
                    bVar2 = botpOCRAStart(in_stack_fffffffffffff4b8,
                                          (char *)in_stack_fffffffffffff4b0,
                                          in_stack_fffffffffffff4a8,
                                          (size_t)in_stack_fffffffffffff4a0);
                    if (bVar2 == 0) {
                      beltH();
                      bVar2 = botpOCRAStart(in_stack_fffffffffffff4b8,
                                            (char *)in_stack_fffffffffffff4b0,
                                            in_stack_fffffffffffff4a8,
                                            (size_t)in_stack_fffffffffffff4a0);
                      if (bVar2 == 0) {
                        beltH();
                        bVar2 = botpOCRAStart(in_stack_fffffffffffff4b8,
                                              (char *)in_stack_fffffffffffff4b0,
                                              in_stack_fffffffffffff4a8,
                                              (size_t)in_stack_fffffffffffff4a0);
                        if (bVar2 == 0) {
                          beltH();
                          bVar2 = botpOCRAStart(in_stack_fffffffffffff4b8,
                                                (char *)in_stack_fffffffffffff4b0,
                                                in_stack_fffffffffffff4a8,
                                                (size_t)in_stack_fffffffffffff4a0);
                          if (bVar2 == 0) {
                            beltH();
                            bVar2 = botpOCRAStart(in_stack_fffffffffffff4b8,
                                                  (char *)in_stack_fffffffffffff4b0,
                                                  in_stack_fffffffffffff4a8,
                                                  (size_t)in_stack_fffffffffffff4a0);
                            if (bVar2 == 0) {
                              beltH();
                              bVar2 = botpOCRAStart(in_stack_fffffffffffff4b8,
                                                    (char *)in_stack_fffffffffffff4b0,
                                                    in_stack_fffffffffffff4a8,
                                                    (size_t)in_stack_fffffffffffff4a0);
                              if (bVar2 == 0) {
                                beltH();
                                bVar2 = botpOCRAStart(in_stack_fffffffffffff4b8,
                                                      (char *)in_stack_fffffffffffff4b0,
                                                      in_stack_fffffffffffff4a8,
                                                      (size_t)in_stack_fffffffffffff4a0);
                                if (bVar2 == 0) {
                                  beltH();
                                  bVar2 = botpOCRAStart(in_stack_fffffffffffff4b8,
                                                        (char *)in_stack_fffffffffffff4b0,
                                                        in_stack_fffffffffffff4a8,
                                                        (size_t)in_stack_fffffffffffff4a0);
                                  if (bVar2 == 0) {
                                    beltH();
                                    bVar2 = botpOCRAStart(in_stack_fffffffffffff4b8,
                                                          (char *)in_stack_fffffffffffff4b0,
                                                          in_stack_fffffffffffff4a8,
                                                          (size_t)in_stack_fffffffffffff4a0);
                                    if (bVar2 != 0) {
                                      beltH();
                                      beltHash(in_stack_fffffffffffff478,in_stack_fffffffffffff470,
                                               (size_t)in_stack_fffffffffffff468);
                                      hexFrom((char *)in_stack_fffffffffffff470,
                                              in_stack_fffffffffffff468,0x113b1a);
                                      beltH();
                                      hexFrom((char *)in_stack_fffffffffffff470,
                                              in_stack_fffffffffffff468,0x113b46);
                                      beltH();
                                      bVar2 = botpOCRAStart(in_stack_fffffffffffff4b8,
                                                            (char *)in_stack_fffffffffffff4b0,
                                                            in_stack_fffffffffffff4a8,
                                                            (size_t)in_stack_fffffffffffff4a0);
                                      if (bVar2 == 0) {
                                        return 0;
                                      }
                                      beltH();
                                      botpOCRAStepS(in_stack_fffffffffffff480,
                                                    in_stack_fffffffffffff478,
                                                    in_stack_fffffffffffff470,
                                                    in_stack_fffffffffffff468);
                                      botpOCRAStepG(in_stack_fffffffffffff470,
                                                    in_stack_fffffffffffff468);
                                      strCopy((char *)in_stack_fffffffffffff480,
                                              (char *)in_stack_fffffffffffff478);
                                      strLen((char *)0x113c6e);
                                      dest = (char *)0x1708ab7;
                                      botpOCRAStepR(in_stack_fffffffffffff4a0,
                                                    in_stack_fffffffffffff498,
                                                    (size_t)in_stack_fffffffffffff490,
                                                    (tm_time_t)in_stack_fffffffffffff488,
                                                    in_stack_fffffffffffff480);
                                      iVar1 = strCmp((char *)in_stack_fffffffffffff470,
                                                     (char *)in_stack_fffffffffffff468);
                                      if (iVar1 != 0) {
                                        return 0;
                                      }
                                      beltH();
                                      botpOCRAStepS(in_stack_fffffffffffff480,
                                                    in_stack_fffffffffffff478,
                                                    in_stack_fffffffffffff470,
                                                    in_stack_fffffffffffff468);
                                      strLen((char *)0x113d4f);
                                      bVar2 = botpOCRAStepV((char *)in_stack_fffffffffffff488,
                                                            in_stack_fffffffffffff480,
                                                            (size_t)in_stack_fffffffffffff478,
                                                            (tm_time_t)in_stack_fffffffffffff470,
                                                            in_stack_fffffffffffff468);
                                      if (bVar2 == 0) {
                                        return 0;
                                      }
                                      beltH();
                                      strLen((char *)0x113dde);
                                      pcVar9 = local_14;
                                      pcVar10 = local_c8;
                                      poVar7 = beltH();
                                      botpOCRARand((char *)in_stack_fffffffffffff498,
                                                   (char *)in_stack_fffffffffffff490,
                                                   in_stack_fffffffffffff488,0x1708ab7,poVar7,
                                                   (size_t)pcVar10,in_stack_fffffffffffff4b0,
                                                   in_stack_fffffffffffff4b8,
                                                   in_stack_fffffffffffff4c0,
                                                   in_stack_fffffffffffff4c8);
                                      iVar1 = strCmp(pcVar10,pcVar9);
                                      if (iVar1 == 0) {
                                        poVar7 = local_28;
                                        p_00 = local_88;
                                        poVar8 = beltH();
                                        poVar8 = poVar8 + 0x80;
                                        pcVar9 = local_a8;
                                        strLen((char *)0x113ecc);
                                        pcVar10 = local_14;
                                        str1 = local_c8;
                                        src = beltH();
                                        eVar3 = botpOCRAVerify((char *)in_stack_fffffffffffff4a8,
                                                               in_stack_fffffffffffff4a0,
                                                               in_stack_fffffffffffff498,
                                                               (size_t)in_stack_fffffffffffff490,
                                                               in_stack_fffffffffffff488,0x1708ab7,
                                                               poVar7,p_00,poVar8,(tm_time_t)pcVar9)
                                        ;
                                        if (eVar3 != 0) {
                                          return 0;
                                        }
                                        strCopy(dest,(char *)src);
                                        strLen((char *)0x113f7d);
                                        strCopy(dest,(char *)src);
                                        strLen((char *)0x113fb9);
                                        botpOCRAStepR(in_stack_fffffffffffff4a0,
                                                      in_stack_fffffffffffff498,
                                                      (size_t)in_stack_fffffffffffff490,
                                                      (tm_time_t)in_stack_fffffffffffff488,dest);
                                        iVar1 = strCmp(str1,pcVar10);
                                        if (iVar1 == 0) {
                                          strCopy(dest,(char *)src);
                                          pcVar9 = local_a8;
                                          strLen((char *)0x11403f);
                                          strCopy(dest,(char *)src);
                                          poVar7 = local_28;
                                          otp_00 = local_a8;
                                          strLen((char *)0x11407b);
                                          botpOCRAStepR(otp_00,poVar7,(size_t)pcVar9,
                                                        (tm_time_t)in_stack_fffffffffffff488,dest);
                                          iVar1 = strCmp(str1,pcVar10);
                                          if (iVar1 == 0) {
                                            return 1;
                                          }
                                          return 0;
                                        }
                                        return 0;
                                      }
                                      return 0;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                return 0;
              }
            }
            return 0;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

bool_t botpTest()
{
	octet ctr[8];
	char otp[16], otp1[16], otp2[16], otp3[16];
	const char suite[] = "OCRA-1:HOTP-HBELT-8:C-QN08-PHBELT-S064-T1M";
	char q[32];
	octet p[32];
	char p_str[72];
	char s_str[136];
	tm_time_t t;
	octet state[2048];
	// подготовить память
	if (sizeof(state) < utilMax(3,
		botpHOTP_keep(),
		botpTOTP_keep(),
		botpOCRA_keep()))
		return FALSE;
	// HOTP.1
	memCopy(ctr, beltH() + 192, 8); 
	botpHOTPStart(state, 8, beltH() + 128, 32);
	botpHOTPStepS(state, ctr);
	botpHOTPStepG(ctr, state);
	botpHOTPStepR(otp, state);
	if (!strEq(otp, "21157984"))
		return FALSE;
	botpHOTPStepS(state, ctr);
	if (!botpHOTPStepV(otp, state))
		return FALSE;
	botpHOTPRand(otp1, 8, beltH() + 128, 32, ctr);
	if (!strEq(otp1, otp) ||
		botpHOTPVerify(otp1, beltH() + 128, 32, ctr) != ERR_OK)
		return FALSE;
	// HOTP.2
	botpHOTPStepR(otp2, state);
	if (!strEq(otp2, "17877985"))
		return FALSE;
	// HOTP.3
	botpHOTPStepR(otp3, state);
	if (!strEq(otp3, "26078636"))
		return FALSE;
	botpHOTPStepG(ctr, state);
	// TOTP.1
	t = 1449165288;
	ASSERT(t != TIME_ERR);
	botpTOTPStart(state, 8, beltH() + 128, 32);
	botpTOTPStepR(otp, t / 60, state);
	if (!strEq(otp, "97660664"))
		return FALSE;
	if (!botpTOTPStepV(otp, t / 60, state))
		return FALSE;
	botpTOTPRand(otp, 8, beltH() + 128, 32, t / 60);
	if (!strEq(otp, "97660664") ||
		botpTOTPVerify(otp, beltH() + 128, 32, t / 60) != ERR_OK)
		return FALSE;
	// TOTP.2
	t /= 60, ++t, t *= 60;
	botpTOTPStart(state, 8, beltH() + 128, 32);
	botpTOTPStepR(otp, t / 60, state);
	if (!strEq(otp, "94431522"))
		return FALSE;
	// TOTP.3
	t /= 60, t += 2, t *= 60, --t;
	botpTOTPStart(state, 8, beltH() + 128, 32);
	botpTOTPStepR(otp, t / 60, state);
	if (!strEq(otp, "55973851"))
		return FALSE;
	// OCRA.format
	if (botpOCRAStart(state, "OCRA-:HOTP-HBELT-6:C-QN08", beltH(), 32) ||
		botpOCRAStart(state, "OCRA-1:HOTP-HBELT-3:C-QN08", beltH(), 32) ||
		botpOCRAStart(state, "OCRA-1:HOTP-HBELT-6-QN08", beltH(), 32) ||
		botpOCRAStart(state, "OCRA-1:HOTP-HBELT-8:C-QA65", beltH(), 32) ||
		botpOCRAStart(state, "OCRA-1:HOTP-HBELT-8:C-QN08-", beltH(), 32) ||
		botpOCRAStart(state, "OCRA-1:HOTP-HBELT-8:C-QN08-PSHA", beltH(), 32) ||
		botpOCRAStart(state, "OCRA-1:HOTP-HBELT-8:QN08-SA13", beltH(), 32) ||
		botpOCRAStart(state, "OCRA-1:HOTP-HBELT-8:QN08-T1N", beltH(), 32) ||
		botpOCRAStart(state, "OCRA-1:HOTP-HBELT-8:QN08-T61S", beltH(), 32) ||
		botpOCRAStart(state, "OCRA-1:HOTP-HBELT-8:QN08-T51H", beltH(), 32) ||
		!botpOCRAStart(state, "OCRA-1:HOTP-HBELT-9:QN08-T8S", beltH(), 32))
		return FALSE;
	// OCRA.1
	beltHash(p, beltH(), 13);
	hexFrom(p_str, p, 32);
	hexFrom(s_str, beltH(), 64); 
	if (!botpOCRAStart(state, suite, beltH() + 128, 32))
		return FALSE;
	botpOCRAStepS(state, ctr, p, beltH());
	botpOCRAStepG(ctr, state);
	t /= 60;
	strCopy(q, otp1);
	botpOCRAStepR(otp, (const octet*)q, strLen(q), t += 3, state);
	if (!strEq(otp, "85199085"))
		return FALSE;
	botpOCRAStepS(state, ctr, p, beltH());
	if (!botpOCRAStepV(otp, (const octet*)q, strLen(q), t, state))
		return FALSE;
	botpOCRARand(otp, suite, beltH() + 128, 32, (const octet*)q, strLen(q), 
		ctr, p, beltH(), t);
	if (!strEq(otp, "85199085"))
		return FALSE;
	if (botpOCRAVerify(otp, suite, beltH() + 128, 32, (const octet*)q, strLen(q), 
		ctr, p, beltH(), t) != ERR_OK)
		return FALSE;
	// OCRA.2
	strCopy(q, otp2);
	strCopy(q + strLen(q), otp3);
	botpOCRAStepR(otp, (const octet*)q, strLen(q), t += 10, state);
	if (!strEq(otp, "89873725"))
		return FALSE;
	// OCRA.3
	strCopy(q, otp3);
	strCopy(q + strLen(q), otp2);
	botpOCRAStepR(otp, (const octet*)q, strLen(q), ++t, state);
	if (!strEq(otp, "21318915"))
		return FALSE;
	// все нормально
	return TRUE;
}